

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O0

void fill_window(deflate_state *s)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  ulong local_30;
  ulg init;
  ulg curr;
  uInt str;
  uInt wsize;
  uint more;
  uint n;
  deflate_state *s_local;
  
  uVar1 = s->w_size;
  do {
    str = ((int)s->window_size - s->lookahead) - s->strstart;
    if (uVar1 + (s->w_size - 0x106) <= s->strstart) {
      memcpy(s->window,s->window + uVar1,(ulong)(uVar1 - str));
      s->match_start = s->match_start - uVar1;
      s->strstart = s->strstart - uVar1;
      s->block_start = s->block_start - (ulong)uVar1;
      if (s->strstart < s->insert) {
        s->insert = s->strstart;
      }
      slide_hash(s);
      str = uVar1 + str;
    }
    if (s->strm->avail_in == 0) break;
    uVar2 = read_buf(s->strm,s->window + (ulong)s->lookahead + (ulong)s->strstart,str);
    s->lookahead = uVar2 + s->lookahead;
    if (2 < s->lookahead + s->insert) {
      curr._0_4_ = s->strstart - s->insert;
      s->ins_h = (uint)s->window[(uint)curr];
      s->ins_h = (s->ins_h << ((byte)s->hash_shift & 0x1f) ^ (uint)s->window[(uint)curr + 1]) &
                 s->hash_mask;
      do {
        if (s->insert == 0) break;
        s->ins_h = (s->ins_h << ((byte)s->hash_shift & 0x1f) ^ (uint)s->window[(uint)curr + 2]) &
                   s->hash_mask;
        s->prev[(uint)curr & s->w_mask] = s->head[s->ins_h];
        s->head[s->ins_h] = (Posf)(uint)curr;
        curr._0_4_ = (uint)curr + 1;
        s->insert = s->insert - 1;
      } while (2 < s->lookahead + s->insert);
    }
    bVar4 = false;
    if (s->lookahead < 0x106) {
      bVar4 = s->strm->avail_in != 0;
    }
  } while (bVar4);
  if (s->high_water < s->window_size) {
    uVar3 = (ulong)s->strstart + (ulong)s->lookahead;
    if (s->high_water < uVar3) {
      local_30 = s->window_size - uVar3;
      if (0x102 < local_30) {
        local_30 = 0x102;
      }
      memset(s->window + uVar3,0,local_30 & 0xffffffff);
      s->high_water = uVar3 + local_30;
    }
    else if (s->high_water < uVar3 + 0x102) {
      local_30 = (uVar3 + 0x102) - s->high_water;
      if (s->window_size - s->high_water < local_30) {
        local_30 = s->window_size - s->high_water;
      }
      memset(s->window + s->high_water,0,local_30 & 0xffffffff);
      s->high_water = local_30 + s->high_water;
    }
  }
  return;
}

Assistant:

static lzma_ret
fill_window(lzma_coder *coder, const lzma_allocator *allocator,
		const uint8_t *in, size_t *in_pos, size_t in_size,
		lzma_action action)
{
	assert(coder->mf.read_pos <= coder->mf.write_pos);

	// Move the sliding window if needed.
	if (coder->mf.read_pos >= coder->mf.size - coder->mf.keep_size_after)
		move_window(&coder->mf);

	// Maybe this is ugly, but lzma_mf uses uint32_t for most things
	// (which I find cleanest), but we need size_t here when filling
	// the history window.
	size_t write_pos = coder->mf.write_pos;
	lzma_ret ret;
	if (coder->next.code == NULL) {
		// Not using a filter, simply memcpy() as much as possible.
		lzma_bufcpy(in, in_pos, in_size, coder->mf.buffer,
				&write_pos, coder->mf.size);

		ret = action != LZMA_RUN && *in_pos == in_size
				? LZMA_STREAM_END : LZMA_OK;

	} else {
		ret = coder->next.code(coder->next.coder, allocator,
				in, in_pos, in_size,
				coder->mf.buffer, &write_pos,
				coder->mf.size, action);
	}

	coder->mf.write_pos = write_pos;

	// Silence Valgrind. lzma_memcmplen() can read extra bytes
	// and Valgrind will give warnings if those bytes are uninitialized
	// because Valgrind cannot see that the values of the uninitialized
	// bytes are eventually ignored.
	memzero(coder->mf.buffer + write_pos, LZMA_MEMCMPLEN_EXTRA);

	// If end of stream has been reached or flushing completed, we allow
	// the encoder to process all the input (that is, read_pos is allowed
	// to reach write_pos). Otherwise we keep keep_size_after bytes
	// available as prebuffer.
	if (ret == LZMA_STREAM_END) {
		assert(*in_pos == in_size);
		ret = LZMA_OK;
		coder->mf.action = action;
		coder->mf.read_limit = coder->mf.write_pos;

	} else if (coder->mf.write_pos > coder->mf.keep_size_after) {
		// This needs to be done conditionally, because if we got
		// only little new input, there may be too little input
		// to do any encoding yet.
		coder->mf.read_limit = coder->mf.write_pos
				- coder->mf.keep_size_after;
	}

	// Restart the match finder after finished LZMA_SYNC_FLUSH.
	if (coder->mf.pending > 0
			&& coder->mf.read_pos < coder->mf.read_limit) {
		// Match finder may update coder->pending and expects it to
		// start from zero, so use a temporary variable.
		const uint32_t pending = coder->mf.pending;
		coder->mf.pending = 0;

		// Rewind read_pos so that the match finder can hash
		// the pending bytes.
		assert(coder->mf.read_pos >= pending);
		coder->mf.read_pos -= pending;

		// Call the skip function directly instead of using
		// mf_skip(), since we don't want to touch mf->read_ahead.
		coder->mf.skip(&coder->mf, pending);
	}

	return ret;
}